

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApiAlsa::probeDevices(RtApiAlsa *this)

{
  RtApi *pRVar1;
  allocator *paVar2;
  snd_ctl_t **ppsVar3;
  string *psVar4;
  undefined4 uVar5;
  pointer ppVar6;
  undefined1 *__s;
  RtApiAlsa *pRVar7;
  const_iterator __position;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__position_00;
  snd_ctl_card_info_t *psVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  __type _Var13;
  long lVar14;
  undefined1 *puVar15;
  size_t sVar16;
  pointer ppVar17;
  reference pvVar18;
  ostream *poVar19;
  char *pcVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  size_type sVar24;
  reference ppVar25;
  reference pDVar26;
  reference ppVar27;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar28;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [20];
  uint local_594;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_590;
  uint local_588;
  undefined1 local_581;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_580;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_578;
  reference local_570;
  allocator *local_568;
  undefined8 local_560;
  snd_ctl_t **local_558;
  undefined8 local_550;
  allocator *local_548;
  snd_ctl_t **local_540;
  undefined8 local_538;
  string *local_530;
  ostream *local_528;
  char *local_520;
  ostream *local_518;
  ostream *local_510;
  ostream *local_508;
  ostream *local_500;
  ostream *local_4f8;
  int local_4f0;
  int local_4ec;
  string *local_4e8;
  ostream *local_4e0;
  char *local_4d8;
  ostream *local_4d0;
  ostream *local_4c8;
  ostream *local_4c0;
  int local_4b4;
  string *local_4b0;
  ostream *local_4a8;
  char *local_4a0;
  ostream *local_498;
  ostream *local_490;
  ostream *local_488;
  int local_47c;
  string *local_478;
  ostream *local_470;
  char *local_468;
  ostream *local_460;
  ostream *local_458;
  ostream *local_450;
  snd_ctl_t **local_448;
  undefined4 local_440;
  int local_43c;
  int local_438;
  int local_434;
  pointer local_430;
  undefined1 *local_428;
  RtApiAlsa *local_420;
  const_iterator local_418;
  DeviceInfo *local_410;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_408;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_400;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_3f8;
  iterator itID;
  __normal_iterator<RtAudio::DeviceInfo_*,_std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>_>
  local_3e8;
  iterator it_1;
  string local_3b8 [32];
  undefined1 local_398 [8];
  DeviceInfo info;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *dID;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2_1;
  bool found_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *d_1;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_2e8;
  reference local_2e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *d;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  iterator iStack_2b8;
  bool found;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_2b0;
  iterator it;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  allocator local_259;
  string local_258 [8];
  string prettyName;
  allocator local_231;
  string local_230 [8];
  string id;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  string local_100 [8];
  string defaultDeviceName;
  undefined1 local_d8 [4];
  snd_pcm_stream_t stream;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  deviceID_prettyName;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_t *ctlinfo;
  snd_ctl_t *handle;
  char name [128];
  uint local_1c;
  uint local_18;
  int card;
  int device;
  int result;
  RtApiAlsa *this_local;
  
  ctlinfo = (snd_ctl_card_info_t *)0x0;
  uStack_5b0 = 0x11dd1a;
  local_420 = this;
  _device = this;
  lVar14 = snd_ctl_card_info_sizeof();
  lVar14 = -(lVar14 + 0xfU & 0xfffffffffffffff0);
  puVar15 = local_5a8 + lVar14;
  local_428 = puVar15;
  *(undefined8 *)((long)&uStack_5b0 + lVar14) = 0x11dd48;
  sVar16 = snd_ctl_card_info_sizeof();
  __s = local_428;
  *(undefined8 *)((long)&uStack_5b0 + lVar14) = 0x11dd59;
  memset(__s,0,sVar16);
  *(undefined8 *)((long)&uStack_5b0 + lVar14) = 0x11dd60;
  lVar14 = snd_pcm_info_sizeof();
  ppVar17 = (pointer)(puVar15 + -(lVar14 + 0xfU & 0xfffffffffffffff0));
  local_430 = ppVar17;
  deviceID_prettyName.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar17;
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11dd8e;
  sVar16 = snd_pcm_info_sizeof();
  ppVar6 = local_430;
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11dd9f;
  memset(ppVar6,0,sVar16);
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ddab;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_d8);
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ddb7;
  std::__cxx11::string::string(local_100);
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ddcc;
  local_434 = snd_ctl_open(&ctlinfo,"default",0);
  card = local_434;
  if (local_434 == 0) {
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de01;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[20],_true>
              (&local_150,(char (*) [8])"default",(char (*) [20])"Default ALSA Device");
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de16;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_d8,&local_150);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de24;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_150);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de34;
    pvVar18 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d8,0);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de47;
    std::__cxx11::string::operator=(local_100,(string *)&pvVar18->second);
    psVar8 = ctlinfo;
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de55;
    snd_ctl_close(psVar8);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11de5c;
    snd_config_update_free_global();
  }
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11deaf;
  local_438 = snd_ctl_open(&ctlinfo,"pulse",0);
  card = local_438;
  if (local_438 == 0) {
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11dee0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_const_char_(&)[24],_true>
              (&local_190,(char (*) [6])"pulse",(char (*) [24])"PulseAudio Sound Server");
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11def5;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_d8,&local_190);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df03;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_190);
    psVar8 = ctlinfo;
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df0f;
    snd_ctl_close(psVar8);
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df16;
    snd_config_update_free_global();
  }
  local_1c = 0xffffffff;
  *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df4d;
  snd_card_next(&local_1c);
  do {
    if ((int)local_1c < 0) {
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e793;
      sVar24 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_d8);
      if (sVar24 == 0) {
        pRVar1 = &local_420->super_RtApi;
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e7ac;
        std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::clear
                  (&pRVar1->deviceList_);
        pvVar28 = &local_420->deviceIdPairs_;
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e7bf;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::clear(pvVar28);
        it._M_current._4_4_ = 1;
      }
      else {
        pvVar28 = &local_420->deviceIdPairs_;
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e7e1;
        local_2b0._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::begin(pvVar28);
        while( true ) {
          pvVar28 = &local_420->deviceIdPairs_;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e7fb;
          iStack_2b8 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::end(pvVar28);
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e815;
          bVar11 = __gnu_cxx::operator!=(&local_2b0,&stack0xfffffffffffffd48);
          if (!bVar11) break;
          bVar11 = false;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e83f;
          __end2 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d8);
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e852;
          d = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_d8);
          while( true ) {
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e86c;
            bVar12 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)&d);
            if (!bVar12) break;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e87e;
            local_570 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ::operator*(&__end2);
            local_2e0 = local_570;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e89f;
            ppVar27 = __gnu_cxx::
                      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator*(&local_2b0);
            ppVar25 = local_570;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e8ae;
            _Var13 = std::operator==(&ppVar25->first,&ppVar27->first);
            if (_Var13) {
              bVar11 = true;
              break;
            }
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e8cb;
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&__end2);
          }
          if (bVar11) {
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e8e2;
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::operator++(&local_2b0);
          }
          else {
            local_580 = &local_420->deviceIdPairs_;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e90b;
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
            ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*>
                      ((__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
                        *)&__range1,&local_2b0);
            __position_00 = __range1;
            pvVar28 = local_580;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e91e;
            local_578 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)std::
                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::erase(pvVar28,(const_iterator)__position_00);
            local_2e8 = local_578;
            local_2b0._M_current = local_578;
          }
        }
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e962;
        __end1 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_d8);
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e975;
        d_1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_d8);
        while( true ) {
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e98f;
          bVar11 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&d_1);
          if (!bVar11) break;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e9a4;
          ppVar25 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&__end1);
          bVar11 = false;
          pvVar28 = &local_420->deviceIdPairs_;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e9d5;
          __end2_1 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::begin(pvVar28);
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e9e8;
          dID = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::end(pvVar28);
          while( true ) {
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea02;
            bVar12 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                 *)&dID);
            if (!bVar12) break;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea14;
            ppVar27 = __gnu_cxx::
                      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator*(&__end2_1);
            info.nativeFormats = (RtAudioFormat)ppVar27;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea2e;
            _Var13 = std::operator==(&ppVar25->first,&ppVar27->first);
            if (_Var13) {
              bVar11 = true;
              break;
            }
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea4b;
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::operator++(&__end2_1);
          }
          if (!bVar11) {
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea67;
            RtAudio::DeviceInfo::DeviceInfo((DeviceInfo *)local_398);
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea7e;
            std::__cxx11::string::operator=((string *)&info,(string *)&ppVar25->second);
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ea93;
            std::__cxx11::string::string(local_3b8,(string *)ppVar25);
            pRVar7 = local_420;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11eaaf;
            local_581 = probeDeviceInfo(pRVar7,(DeviceInfo *)local_398,(string *)local_3b8);
            local_588 = (uint)(byte)local_581;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ead4;
            std::__cxx11::string::~string(local_3b8);
            if (local_588 == 0) {
              it._M_current._4_4_ = 0x10;
            }
            else {
              local_398._0_4_ = (local_420->super_RtApi).currentDeviceId_;
              (local_420->super_RtApi).currentDeviceId_ = local_398._0_4_ + 1;
              *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11eb5d;
              _Var13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&info,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_100);
              if (_Var13) {
                if (info._32_4_ != 0) {
                  info.inputChannels._0_1_ = 1;
                }
                if (info._36_4_ != 0) {
                  info.inputChannels._1_1_ = 1;
                }
              }
              pRVar1 = &local_420->super_RtApi;
              *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11eb9f;
              std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                        (&pRVar1->deviceList_,(value_type *)local_398);
              local_590 = &local_420->deviceIdPairs_;
              *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ebcf;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)&it_1,&ppVar25->first,(uint *)local_398);
              pvVar28 = local_590;
              *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ebe4;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::push_back(pvVar28,(value_type *)&it_1);
              *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ebf2;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)&it_1);
              it._M_current._4_4_ = 0;
            }
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ec08;
            RtAudio::DeviceInfo::~DeviceInfo((DeviceInfo *)local_398);
          }
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ec24;
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end1);
        }
        pRVar1 = &local_420->super_RtApi;
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ec6b;
        local_3e8._M_current =
             (DeviceInfo *)
             std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::begin
                       (&pRVar1->deviceList_);
        while( true ) {
          pRVar1 = &local_420->super_RtApi;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ec85;
          itID._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::end
                            (&pRVar1->deviceList_);
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ec9f;
          bVar11 = __gnu_cxx::operator!=
                             (&local_3e8,
                              (__normal_iterator<RtAudio::DeviceInfo_*,_std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>_>
                               *)&itID);
          if (!bVar11) break;
          pvVar28 = &local_420->deviceIdPairs_;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ecbb;
          local_3f8._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::begin(pvVar28);
          while( true ) {
            pvVar28 = &local_420->deviceIdPairs_;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ecd5;
            local_400._M_current =
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::end(pvVar28);
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ecef;
            bVar11 = __gnu_cxx::operator!=(&local_3f8,&local_400);
            if (!bVar11) break;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed01;
            pDVar26 = __gnu_cxx::
                      __normal_iterator<RtAudio::DeviceInfo_*,_std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>_>
                      ::operator*(&local_3e8);
            local_594 = pDVar26->ID;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed15;
            ppVar27 = __gnu_cxx::
                      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator*(&local_3f8);
            if (local_594 == ppVar27->second) break;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed31;
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::operator++(&local_3f8);
          }
          pvVar28 = &local_420->deviceIdPairs_;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed46;
          local_408._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::end(pvVar28);
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed60;
          bVar11 = __gnu_cxx::operator==(&local_3f8,&local_408);
          if (bVar11) {
            local_5a8._0_8_ = &(local_420->super_RtApi).deviceList_;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11ed8d;
            __gnu_cxx::
            __normal_iterator<RtAudio::DeviceInfo_const*,std::vector<RtAudio::DeviceInfo,std::allocator<RtAudio::DeviceInfo>>>
            ::__normal_iterator<RtAudio::DeviceInfo*>
                      ((__normal_iterator<RtAudio::DeviceInfo_const*,std::vector<RtAudio::DeviceInfo,std::allocator<RtAudio::DeviceInfo>>>
                        *)&local_418,&local_3e8);
            __position._M_current = local_418._M_current;
            uVar21 = local_5a8._0_8_;
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11eda0;
            local_5a8._8_8_ =
                 std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::erase
                           ((vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> *)
                            uVar21,__position);
            local_410 = (DeviceInfo *)local_5a8._8_8_;
            local_3e8._M_current = (DeviceInfo *)local_5a8._8_8_;
          }
          else {
            *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11edd3;
            __gnu_cxx::
            __normal_iterator<RtAudio::DeviceInfo_*,_std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>_>
            ::operator++(&local_3e8);
          }
        }
        it._M_current._4_4_ = 0;
      }
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11edee;
      std::__cxx11::string::~string(local_100);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11edfa;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_d8);
      return;
    }
    uVar23 = (ulong)local_1c;
    local_440 = 0;
    local_448 = &handle;
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df80;
    sprintf((char *)&handle,"hw:%d",uVar23);
    uVar5 = local_440;
    ppsVar3 = local_448;
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11df99;
    local_43c = snd_ctl_open(&ctlinfo,ppsVar3,uVar5);
    psVar8 = ctlinfo;
    card = local_43c;
    if (local_43c < 0) {
      ctlinfo = (snd_ctl_card_info_t *)0x0;
      pRVar1 = &local_420->super_RtApi;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11dfd6;
      poVar19 = std::operator<<((ostream *)&pRVar1->errorStream_,
                                "RtApiAlsa::probeDevices: control open, card = ");
      uVar9 = local_1c;
      local_450 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11dfee;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar9);
      local_458 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e00a;
      local_460 = std::operator<<(poVar19,", ");
      iVar10 = card;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e01b;
      pcVar20 = (char *)snd_strerror(iVar10);
      poVar19 = local_460;
      local_468 = pcVar20;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e037;
      poVar19 = std::operator<<(poVar19,pcVar20);
      local_470 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e053;
      std::operator<<(poVar19,".");
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e06c;
      std::__cxx11::ostringstream::str();
      pRVar1 = &local_420->super_RtApi;
      local_478 = local_1b0;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e08f;
      std::__cxx11::string::operator=((string *)&pRVar1->errorText_,local_1b0);
      psVar4 = local_478;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e09b;
      std::__cxx11::string::~string(psVar4);
      pRVar7 = local_420;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e0ac;
      RtApi::error(&pRVar7->super_RtApi,RTAUDIO_WARNING);
    }
    else {
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e0c6;
      local_47c = snd_ctl_card_info(psVar8,puVar15);
      card = local_47c;
      if (-1 < local_47c) {
        local_18 = 0xffffffff;
LAB_0011e1dc:
        psVar8 = ctlinfo;
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e1ee;
        local_4b4 = snd_ctl_pcm_next_device(psVar8,&local_18);
        uVar9 = local_18;
        ppVar6 = deviceID_prettyName.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        card = local_4b4;
        if (local_4b4 < 0) {
          pRVar1 = &local_420->super_RtApi;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e220;
          poVar19 = std::operator<<((ostream *)&pRVar1->errorStream_,
                                    "RtApiAlsa::probeDevices: control next device, card = ");
          uVar9 = local_1c;
          local_4c0 = poVar19;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e238;
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar9);
          local_4c8 = poVar19;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e254;
          local_4d0 = std::operator<<(poVar19,", ");
          iVar10 = card;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e265;
          pcVar20 = (char *)snd_strerror(iVar10);
          poVar19 = local_4d0;
          local_4d8 = pcVar20;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e281;
          poVar19 = std::operator<<(poVar19,pcVar20);
          local_4e0 = poVar19;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e29d;
          std::operator<<(poVar19,".");
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e2b6;
          std::__cxx11::ostringstream::str();
          pRVar1 = &local_420->super_RtApi;
          local_4e8 = local_1f0;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e2d9;
          std::__cxx11::string::operator=((string *)&pRVar1->errorText_,local_1f0);
          psVar4 = local_4e8;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e2e5;
          std::__cxx11::string::~string(psVar4);
          pRVar7 = local_420;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e2f6;
          RtApi::error(&pRVar7->super_RtApi,RTAUDIO_WARNING);
        }
        else if (-1 < (int)local_18) {
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e317;
          snd_pcm_info_set_device(ppVar6,uVar9);
          ppVar6 = deviceID_prettyName.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e327;
          snd_pcm_info_set_subdevice(ppVar6,0);
          ppVar6 = deviceID_prettyName.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e345;
          snd_pcm_info_set_stream(ppVar6,0);
          psVar8 = ctlinfo;
          ppVar6 = deviceID_prettyName.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e35a;
          local_4ec = snd_ctl_pcm_info(psVar8,ppVar6);
          ppVar6 = deviceID_prettyName.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          card = local_4ec;
          if (local_4ec < 0) break;
          goto LAB_0011e4fc;
        }
        goto LAB_0011e756;
      }
      pRVar1 = &local_420->super_RtApi;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e0f8;
      poVar19 = std::operator<<((ostream *)&pRVar1->errorStream_,
                                "RtApiAlsa::probeDevices: control info, card = ");
      uVar9 = local_1c;
      local_488 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e110;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar9);
      local_490 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e12c;
      local_498 = std::operator<<(poVar19,", ");
      iVar10 = card;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e13d;
      pcVar20 = (char *)snd_strerror(iVar10);
      poVar19 = local_498;
      local_4a0 = pcVar20;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e159;
      poVar19 = std::operator<<(poVar19,pcVar20);
      local_4a8 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e175;
      std::operator<<(poVar19,".");
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e18e;
      std::__cxx11::ostringstream::str();
      pRVar1 = &local_420->super_RtApi;
      local_4b0 = local_1d0;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e1b1;
      std::__cxx11::string::operator=((string *)&pRVar1->errorText_,local_1d0);
      psVar4 = local_4b0;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e1bd;
      std::__cxx11::string::~string(psVar4);
      pRVar7 = local_420;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e1ce;
      RtApi::error(&pRVar7->super_RtApi,RTAUDIO_WARNING);
    }
LAB_0011e756:
    psVar8 = ctlinfo;
    if (ctlinfo != (snd_ctl_card_info_t *)0x0) {
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e76c;
      snd_ctl_close(psVar8);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e773;
      snd_config_update_free_global();
    }
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e780;
    snd_card_next(&local_1c);
  } while( true );
  if (local_4ec == -2) {
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e39b;
    snd_pcm_info_set_stream(ppVar6,1);
    psVar8 = ctlinfo;
    ppVar6 = deviceID_prettyName.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e3b0;
    local_4f0 = snd_ctl_pcm_info(psVar8,ppVar6);
    card = local_4f0;
    if (local_4f0 < 0) {
      pRVar1 = &local_420->super_RtApi;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e3e2;
      poVar19 = std::operator<<((ostream *)&pRVar1->errorStream_,
                                "RtApiAlsa::probeDevices: control pcm info, card = ");
      uVar9 = local_1c;
      local_4f8 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e3fa;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar9);
      local_500 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e416;
      poVar19 = std::operator<<(poVar19,", device = ");
      uVar9 = local_18;
      local_508 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e42e;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar9);
      local_510 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e44a;
      local_518 = std::operator<<(poVar19,", ");
      iVar10 = card;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e45b;
      pcVar20 = (char *)snd_strerror(iVar10);
      poVar19 = local_518;
      local_520 = pcVar20;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e477;
      poVar19 = std::operator<<(poVar19,pcVar20);
      local_528 = poVar19;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e493;
      std::operator<<(poVar19,".");
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e4ac;
      std::__cxx11::ostringstream::str();
      pRVar1 = &local_420->super_RtApi;
      local_530 = local_210;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e4cf;
      std::__cxx11::string::operator=((string *)&pRVar1->errorText_,local_210);
      psVar4 = local_530;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e4db;
      std::__cxx11::string::~string(psVar4);
      pRVar7 = local_420;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e4ec;
      RtApi::error(&pRVar7->super_RtApi,RTAUDIO_WARNING);
    }
    else {
LAB_0011e4fc:
      local_540 = &handle;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e516;
      uVar21 = snd_ctl_card_info_get_id(puVar15);
      ppsVar3 = local_540;
      uVar23 = (ulong)local_18;
      local_538 = uVar21;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e53e;
      sprintf((char *)ppsVar3,"hw:%s,%d",uVar21,uVar23);
      local_548 = &local_231;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e551;
      std::allocator<char>::allocator();
      paVar2 = local_548;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e56b;
      std::__cxx11::string::string(local_230,(char *)&handle,paVar2);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e579;
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      local_558 = &handle;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e593;
      local_550 = snd_ctl_card_info_get_name(puVar15);
      ppVar6 = deviceID_prettyName.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e5a8;
      uVar22 = snd_pcm_info_get_id(ppVar6);
      uVar21 = local_550;
      ppsVar3 = local_558;
      local_560 = uVar22;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e5d4;
      sprintf((char *)ppsVar3,"%s (%s)",uVar21,uVar22);
      local_568 = &local_259;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e5e7;
      std::allocator<char>::allocator();
      paVar2 = local_568;
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e601;
      std::__cxx11::string::string(local_258,(char *)&handle,paVar2);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e60f;
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e629;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e63e;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_d8,&local_2a0);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e64c;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_2a0);
      if ((local_1c == 0) && (local_18 == 0)) {
        *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e66c;
        uVar23 = std::__cxx11::string::empty();
        if ((uVar23 & 1) != 0) {
          *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e688;
          std::__cxx11::string::operator=(local_100,(char *)&handle);
        }
      }
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e726;
      std::__cxx11::string::~string(local_258);
      *(undefined8 *)&ppVar17[-1].field_0x38 = 0x11e732;
      std::__cxx11::string::~string(local_230);
    }
  }
  goto LAB_0011e1dc;
}

Assistant:

void RtApiAlsa :: probeDevices( void )
{
  // See list of required functionality in RtApi::probeDevices().
  
  int result, device, card;
  char name[128];
  snd_ctl_t *handle = 0;
  snd_ctl_card_info_t *ctlinfo;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&ctlinfo);
  snd_pcm_info_alloca(&pcminfo);
  // First element isthe device hw ID, second is the device "pretty name"
  std::vector<std::pair<std::string, std::string>> deviceID_prettyName;
  snd_pcm_stream_t stream;
  std::string defaultDeviceName;

  // Add the default interface if available.
  result = snd_ctl_open( &handle, "default", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"default", "Default ALSA Device"});
    defaultDeviceName = deviceID_prettyName[0].second;
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }

  // Add the Pulse interface if available.
  result = snd_ctl_open( &handle, "pulse", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"pulse",  "PulseAudio Sound Server"});
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }
  
  // Count cards and devices and get ascii identifiers.
  card = -1;
  snd_card_next( &card );
  while ( card >= 0 ) {
    sprintf( name, "hw:%d", card );
    result = snd_ctl_open( &handle, name, 0 );
    if ( result < 0 ) {
      handle = 0;
      errorStream_ << "RtApiAlsa::probeDevices: control open, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    result = snd_ctl_card_info( handle, ctlinfo );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::probeDevices: control info, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    device = -1;
    while( 1 ) {
      result = snd_ctl_pcm_next_device( handle, &device );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::probeDevices: control next device, card = " << card << ", " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        error( RTAUDIO_WARNING );
        break;
      }
      if ( device < 0 )
        break;

      snd_pcm_info_set_device( pcminfo, device );
      snd_pcm_info_set_subdevice( pcminfo, 0 );
      stream = SND_PCM_STREAM_PLAYBACK;
      snd_pcm_info_set_stream( pcminfo, stream );
      result = snd_ctl_pcm_info( handle, pcminfo );
      if ( result < 0 ) {
        if ( result == -ENOENT ) { // try as input stream
          stream = SND_PCM_STREAM_CAPTURE;
          snd_pcm_info_set_stream( pcminfo, stream );
          result = snd_ctl_pcm_info( handle, pcminfo );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::probeDevices: control pcm info, card = " << card << ", device = " << device << ", " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
            error( RTAUDIO_WARNING );
            continue;
          }
        }
        else continue;
      }
      sprintf( name, "hw:%s,%d", snd_ctl_card_info_get_id(ctlinfo), device );
      std::string id(name);
      sprintf( name, "%s (%s)", snd_ctl_card_info_get_name(ctlinfo), snd_pcm_info_get_id(pcminfo) );
      std::string prettyName(name);
      deviceID_prettyName.push_back( {id, prettyName} );
      if ( card == 0 && device == 0 && defaultDeviceName.empty() )
        defaultDeviceName = name;
    }
  nextcard:
    if ( handle ) {
      snd_ctl_close( handle );
      snd_config_update_free_global();
    }
    snd_card_next( &card );
  }

  if ( deviceID_prettyName.size() == 0 ) {
    deviceList_.clear();
    deviceIdPairs_.clear();
    return;
  }

  // Clean removed devices
  for ( auto it = deviceIdPairs_.begin(); it != deviceIdPairs_.end(); ) {
    bool found = false;
    for ( auto& d: deviceID_prettyName ) {
      if ( d.first == (*it).first ) {
        found = true;
        break;
      }
    }

    if ( found )
      ++it;
    else
      it = deviceIdPairs_.erase(it);
  }

  // Fill or update the deviceList_ and also save a corresponding list of Ids.
  for ( auto& d : deviceID_prettyName ) {
    bool found = false;
    for ( auto& dID : deviceIdPairs_ ) {
      if ( d.first == dID.first ) {
        found = true;
        break; // We already have this device.
      }
    }

    if ( found )
      continue;

    // new device
    RtAudio::DeviceInfo info;
    info.name = d.second;
    if ( probeDeviceInfo( info, d.first ) == false ) continue; // ignore if probe fails
    info.ID = currentDeviceId_++;  // arbitrary internal device ID
    if ( info.name == defaultDeviceName ) {
      if ( info.outputChannels > 0 ) info.isDefaultOutput = true;
      if ( info.inputChannels > 0 ) info.isDefaultInput = true;
    }
    deviceList_.push_back( info );
    deviceIdPairs_.push_back({d.first, info.ID});
    // I don't see that ALSA provides property listeners to know if
    // devices are removed or added.
  }

  // Remove any devices left in the list that are no longer available.
  for ( std::vector<RtAudio::DeviceInfo>::iterator it=deviceList_.begin(); it!=deviceList_.end(); )
  {
    auto itID = deviceIdPairs_.begin();
    while ( itID != deviceIdPairs_.end() ) {
      if ( (*it).ID == (*itID).second ) {
        break;
      }
      ++itID;
    }

    if ( itID == deviceIdPairs_.end() ) {
      // not found so remove it from our list
      it = deviceList_.erase( it );
    }
    else
      ++it;
  }
}